

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ralloc.c
# Opt level: O0

void * rzalloc_array_size(void *ctx,size_t size,uint count)

{
  undefined1 auVar1 [16];
  uint count_local;
  size_t size_local;
  void *ctx_local;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = size;
  if (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0xffffffffffffffff)) / auVar1,0) < (ulong)count) {
    ctx_local = (void *)0x0;
  }
  else {
    ctx_local = rzalloc_size(ctx,size * count);
  }
  return ctx_local;
}

Assistant:

void *
rzalloc_array_size(const void *ctx, size_t size, unsigned count)
{
   if (count > SIZE_MAX/size)
      return NULL;

   return rzalloc_size(ctx, size * count);
}